

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

cmJSONHelper<int> * cmJSONHelperBuilder::Int(cmJSONHelper<int> *__return_storage_ptr__,int defval)

{
  ErrorGenerator local_38;
  int local_14;
  cmJSONHelper<int> *pcStack_10;
  int defval_local;
  
  local_14 = defval;
  pcStack_10 = __return_storage_ptr__;
  std::function<void(Json::Value_const*,cmJSONState*)>::
  function<void(&)(Json::Value_const*,cmJSONState*),void>
            ((function<void(Json::Value_const*,cmJSONState*)> *)&local_38,JsonErrors::INVALID_INT);
  Int(__return_storage_ptr__,&local_38,local_14);
  std::function<void_(const_Json::Value_*,_cmJSONState_*)>::~function(&local_38);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<int> Int(int defval)
  {
    return Int(JsonErrors::INVALID_INT, defval);
  }